

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::BeginLoopInst::Exec
          (BeginLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int iVar1;
  CharCount CVar2;
  Label LVar3;
  PageAllocation *pPVar4;
  uint8 *puVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  size_t sVar9;
  Program *pPVar10;
  uint8 *puVar11;
  LoopInfo *pLVar12;
  ArenaAllocator *alloc;
  uint uVar13;
  uchar *puVar14;
  
  iVar1 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
  if (((long)iVar1 < 0) || (((matcher->program).ptr)->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar7) goto LAB_00ef764d;
    *puVar8 = 0;
  }
  pLVar12 = (matcher->loopInfos).ptr + iVar1;
  if (((this->super_GreedyMixin).isGreedy == false) &&
     ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops == true)) {
    sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar9 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
      sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef764d;
      *puVar8 = 0;
    }
    pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar9 + 0x28;
    *(size_t *)((long)&pPVar4[1].pageCount + sVar9) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    iVar1 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
    *(undefined1 *)((long)&pPVar4[2].pageCount + sVar9) = 1;
    *(undefined ***)((long)&pPVar4[1].segment + sVar9) = &PTR_Print_01543488;
    *(int *)((long)&pPVar4[2].pageCount + sVar9 + 4) = iVar1;
    *(undefined8 *)((long)&pPVar4[2].segment + sVar9) = *(undefined8 *)pLVar12;
    *(undefined8 *)((long)&pPVar4[3].pageCount + sVar9) = 0;
    if (pLVar12->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014d5058;
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar4[3].pageCount + sVar9) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar12->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar13 = (this->super_BodyGroupsMixin).minBodyGroupId;
  if ((int)uVar13 <= (this->super_BodyGroupsMixin).maxBodyGroupId) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (((int)uVar13 < 0) || (((matcher->program).ptr)->numGroups <= uVar13)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
      }
      if ((matcher->groupInfos).ptr[(int)uVar13].length != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xb58,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                           "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
      }
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 <= (this->super_BodyGroupsMixin).maxBodyGroupId);
  }
  pLVar12->number = 0;
  pLVar12->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((this->super_GreedyMixin).isGreedy == true) {
      sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
      if (sVar9 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                  super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.bufferSize;
      }
      if (sVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar7) {
LAB_00ef764d:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar8 = 0;
      }
      pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar9 + 0x20;
      *(size_t *)((long)&pPVar4[1].pageCount + sVar9) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      CVar2 = *inputOffset;
      LVar3 = (this->super_BeginLoopMixin).exitLabel;
      *(undefined1 *)((long)&pPVar4[2].pageCount + sVar9) = 0;
      *(undefined ***)((long)&pPVar4[1].segment + sVar9) = &PTR_Print_015432a8;
      *(CharCount *)((long)&pPVar4[2].pageCount + sVar9 + 4) = CVar2;
      *(Label *)((long)&pPVar4[2].segment + sVar9) = LVar3;
      puVar14 = *instPointer + 0x1c;
    }
    else {
      if ((BeginLoopInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xb6a,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
      }
      sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
      if (sVar9 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                  super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.bufferSize;
      }
      if (sVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
      }
      pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar9 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar9 + 0x20;
      *(size_t *)((long)&pPVar4[1].pageCount + sVar9) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      puVar5 = *instPointer;
      pPVar10 = (matcher->program).ptr;
      puVar11 = *(uint8 **)&pPVar10->rep;
      if ((puVar5 < puVar11) || (puVar11 + (pPVar10->rep).insts.instsLen <= puVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x767,
                           "(inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen)"
                           ,
                           "inst >= program->rep.insts.insts && inst < program->rep.insts.insts + program->rep.insts.instsLen"
                          );
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
        pPVar10 = (matcher->program).ptr;
        puVar11 = *(uint8 **)&pPVar10->rep;
      }
      CVar2 = *inputOffset;
      *(undefined1 *)((long)&pPVar4[2].pageCount + sVar9) = 5;
      *(undefined ***)((long)&pPVar4[1].segment + sVar9) = &PTR_Print_01543368;
      *(int *)((long)&pPVar4[2].pageCount + sVar9 + 4) = (int)puVar5 - (int)puVar11;
      *(CharCount *)((long)&pPVar4[2].segment + sVar9) = CVar2;
      uVar13 = (this->super_BeginLoopMixin).exitLabel;
      if ((pPVar10->rep).insts.instsLen <= uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x76d,"(label < program->rep.insts.instsLen)",
                           "label < program->rep.insts.instsLen");
        if (!bVar7) goto LAB_00ef764d;
        *puVar8 = 0;
        pPVar10 = (matcher->program).ptr;
      }
      puVar14 = (pPVar10->rep).insts.insts.ptr + uVar13;
    }
    *instPointer = puVar14;
    Matcher::PushStats(matcher,contStack,input);
  }
  else {
    *instPointer = *instPointer + 0x1c;
  }
  return false;
}

Assistant:

inline bool BeginLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop has outer loops, the continuation stack may have choicepoints from an earlier "run" of this loop
        // which, when backtracked to, may expect the loopInfo state to be as it was at the time the choicepoint was
        // pushed.
        //  - If the loop is greedy with deterministic body, there may be Resumes into the follow of the loop, but
        //    they won't look at the loopInfo state so there's nothing to do.
        //  - If the loop is greedy, or if it is non-greedy with lower > 0, AND it has a non-deterministic body,
        //    we may have Resume entries which will resume inside the loop body, which may then run to a
        //    RepeatLoop, which will then look at the loopInfo state. However, each iteration is protected by
        //    a RestoreLoop by RepeatLoopInst below. (****)
        //  - If the loop is non-greedy there may be a RepeatLoop on the stack, so we must restore the loopInfo
        //    state before backtracking to it.
        if (!isGreedy && hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // The loop body must always begin with empty inner groups
        //  - if the loop is not in an outer they will be empty due to the reset when the match began
        //  - if the loop is in an outer loop, they will have been reset by the outer loop's RepeatLoop instruction
#if DBG
        for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
        {
            Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
        }
#endif

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            if (isGreedy)
            {
                // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
                PUSH(contStack, ResumeCont, inputOffset, exitLabel);
                instPointer += sizeof(*this);
            }
            else
            {
                // CHOICEPOINT: Try no iterations of body, if backtrack do one iteration of body from here
                Assert(instPointer == (uint8*)this);
                PUSH(contStack, RepeatLoopCont, matcher.InstPointerToLabel(instPointer), inputOffset);
                instPointer = matcher.LabelToInstPointer(exitLabel);
            }
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        else
        {
            // Must match minimum iterations, so continue to loop body
            instPointer += sizeof(*this);
        }

        return false;
    }